

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondStamp.hpp
# Opt level: O0

void __thiscall
OpenMD::BondStamp::setMembers(BondStamp *this,vector<int,_std::allocator<int>_> *members)

{
  size_type sVar1;
  reference pvVar2;
  ostream *poVar3;
  undefined8 uVar4;
  string *msg;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  ostringstream oss_1;
  ostringstream oss;
  string *in_stack_fffffffffffffc08;
  OpenMDException *in_stack_fffffffffffffc10;
  OpenMDException *this_00;
  string local_378 [32];
  OpenMDException local_358 [6];
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffda8;
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  if (sVar1 != 2) {
    this_00 = local_358;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    poVar3 = std::operator<<((ostream *)this_00,"BondStamp Error: members");
    containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffffda8);
    msg = (string *)std::operator<<(poVar3,local_378);
    poVar3 = std::operator<<((ostream *)msg," is invalid");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_378);
    uVar4 = __cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    OpenMDException::OpenMDException(this_00,msg);
    __cxa_throw(uVar4,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,0);
  *(value_type *)(in_RDI + 0xa0) = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,1);
  *(value_type *)(in_RDI + 0xa4) = *pvVar2;
  if ((-1 < *(int *)(in_RDI + 0xa0)) && (-1 < *(int *)(in_RDI + 0xa4))) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar3 = std::operator<<((ostream *)local_188,"BondStamp Error: members");
  containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffffda8);
  poVar3 = std::operator<<(poVar3,local_1b8);
  poVar3 = std::operator<<(poVar3," is invalid");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1b8);
  uVar4 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  OpenMDException::OpenMDException(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  __cxa_throw(uVar4,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void setMembers(std::vector<int> members) {
      if (members.size() == 2) {
        a = members[0];
        b = members[1];
        if (a < 0 || b < 0) {
          std::ostringstream oss;
          oss << "BondStamp Error: members" << containerToString(members)
              << " is invalid" << std::endl;
          throw OpenMDException(oss.str());
        }
      } else {
        std::ostringstream oss;
        oss << "BondStamp Error: members" << containerToString(members)
            << " is invalid" << std::endl;
        throw OpenMDException(oss.str());
      }
    }